

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

DynamicProfileInfo * __thiscall
Js::SourceDynamicProfileManager::GetDynamicProfileInfo
          (SourceDynamicProfileManager *this,FunctionBody *functionBody)

{
  uint uVar1;
  bool bVar2;
  SourceContextInfo *pSVar3;
  DynamicProfileInfo *local_28;
  DynamicProfileInfo *dynamicProfileInfo;
  LocalFunctionId functionId;
  
  dynamicProfileInfo._4_4_ = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  local_28 = (DynamicProfileInfo *)0x0;
  if ((0 < (this->dynamicProfileInfoMap).count - (this->dynamicProfileInfoMap).freeCount) &&
     (bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (&this->dynamicProfileInfoMap,(uint *)((long)&dynamicProfileInfo + 4),
                         &local_28), bVar2)) {
    bVar2 = DynamicProfileInfo::MatchFunctionBody(local_28,functionBody);
    if (bVar2) {
      return local_28;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,DynamicProfilePhase);
    uVar1 = dynamicProfileInfo._4_4_;
    if (bVar2) {
      pSVar3 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)functionBody);
      Output::Print(L"TRACE: DynamicProfile: Profile data rejected for function %d in %s\n",
                    (ulong)uVar1,(pSVar3->field_5).field_0.url);
      Output::Flush();
      return (DynamicProfileInfo *)0x0;
    }
  }
  return (DynamicProfileInfo *)0x0;
}

Assistant:

DynamicProfileInfo *
    SourceDynamicProfileManager::GetDynamicProfileInfo(FunctionBody * functionBody)
    {
        Js::LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        if (dynamicProfileInfoMap.Count() > 0 && dynamicProfileInfoMap.TryGetValue(functionId, &dynamicProfileInfo))
        {
            if (dynamicProfileInfo->MatchFunctionBody(functionBody))
            {
                return dynamicProfileInfo;
            }

#if DBG_DUMP
            if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::DynamicProfilePhase))
            {
                Output::Print(_u("TRACE: DynamicProfile: Profile data rejected for function %d in %s\n"),
                    functionId, functionBody->GetSourceContextInfo()->url);
                Output::Flush();
            }
#endif
            // NOTE: We have profile mismatch, we can invalidate all other profile here.
        }
        return nullptr;
    }